

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

decNumber *
uprv_decNumberCompareTotalMag_63(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set)

{
  uint local_c8;
  uint local_c4;
  decContext *local_c0;
  decNumber *b;
  decNumber *a;
  decNumber *allocbufb;
  decNumber bufb [4];
  decNumber *local_70;
  decNumber *allocbufa;
  decNumber bufa [4];
  uint32_t local_2c;
  uint32_t needbytes;
  uint32_t status;
  decContext *set_local;
  decNumber *rhs_local;
  decNumber *lhs_local;
  decNumber *res_local;
  
  local_2c = 0;
  local_70 = (decNumber *)0x0;
  a = (decNumber *)0x0;
  _needbytes = set;
  set_local = (decContext *)rhs;
  rhs_local = lhs;
  lhs_local = res;
  if ((lhs->bits & 0x80) != 0) {
    b = (decNumber *)&allocbufa;
    if (lhs->digits < 0x32) {
      local_c4 = (uint)""[lhs->digits];
    }
    else {
      local_c4 = lhs->digits / 1;
    }
    if ((0x30 < local_c4 + 0xb) &&
       (b = (decNumber *)uprv_malloc_63((ulong)(local_c4 + 0xb)), local_70 = b,
       b == (decNumber *)0x0)) {
      local_2c = local_2c | 0x10;
      goto LAB_002be7e1;
    }
    uprv_decNumberCopy_63(b,rhs_local);
    b->bits = b->bits & 0x7f;
    rhs_local = b;
  }
  if ((set_local->emin & 0x80) != 0) {
    local_c0 = (decContext *)&allocbufb;
    if (set_local->digits < 0x32) {
      local_c8 = (uint)""[set_local->digits];
    }
    else {
      local_c8 = set_local->digits / 1;
    }
    if ((0x30 < local_c8 + 0xb) &&
       (local_c0 = (decContext *)uprv_malloc_63((ulong)(local_c8 + 0xb)), a = (decNumber *)local_c0,
       local_c0 == (decContext *)0x0)) {
      local_2c = local_2c | 0x10;
      goto LAB_002be7e1;
    }
    uprv_decNumberCopy_63((decNumber *)local_c0,(decNumber *)set_local);
    *(byte *)&local_c0->emin = (byte)local_c0->emin & 0x7f;
    set_local = local_c0;
  }
  decCompareOp(lhs_local,rhs_local,(decNumber *)set_local,_needbytes,'\x04',&local_2c);
LAB_002be7e1:
  if (local_70 != (decNumber *)0x0) {
    uprv_free_63(local_70);
  }
  if (a != (decNumber *)0x0) {
    uprv_free_63(a);
  }
  if (local_2c != 0) {
    decStatus(lhs_local,local_2c,_needbytes);
  }
  return lhs_local;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberCompareTotalMag(decNumber *res, const decNumber *lhs,
                                     const decNumber *rhs, decContext *set) {
  uInt status=0;                   /* accumulator  */
  uInt needbytes;                  /* for space calculations  */
  decNumber bufa[D2N(DECBUFFER+1)];/* +1 in case DECBUFFER=0  */
  decNumber *allocbufa=NULL;       /* -> allocated bufa, iff allocated  */
  decNumber bufb[D2N(DECBUFFER+1)];
  decNumber *allocbufb=NULL;       /* -> allocated bufb, iff allocated  */
  decNumber *a, *b;                /* temporary pointers  */

  #if DECCHECK
  if (decCheckOperands(res, lhs, rhs, set)) return res;
  #endif

  do {                                  /* protect allocated storage  */
    /* if either is negative, take a copy and absolute  */
    if (decNumberIsNegative(lhs)) {     /* lhs<0  */
      a=bufa;
      needbytes=sizeof(decNumber)+(D2U(lhs->digits)-1)*sizeof(Unit);
      if (needbytes>sizeof(bufa)) {     /* need malloc space  */
        allocbufa=(decNumber *)malloc(needbytes);
        if (allocbufa==NULL) {          /* hopeless -- abandon  */
          status|=DEC_Insufficient_storage;
          break;}
        a=allocbufa;                    /* use the allocated space  */
        }
      uprv_decNumberCopy(a, lhs);            /* copy content  */
      a->bits&=~DECNEG;                 /* .. and clear the sign  */
      lhs=a;                            /* use copy from here on  */
      }
    if (decNumberIsNegative(rhs)) {     /* rhs<0  */
      b=bufb;
      needbytes=sizeof(decNumber)+(D2U(rhs->digits)-1)*sizeof(Unit);
      if (needbytes>sizeof(bufb)) {     /* need malloc space  */
        allocbufb=(decNumber *)malloc(needbytes);
        if (allocbufb==NULL) {          /* hopeless -- abandon  */
          status|=DEC_Insufficient_storage;
          break;}
        b=allocbufb;                    /* use the allocated space  */
        }
      uprv_decNumberCopy(b, rhs);            /* copy content  */
      b->bits&=~DECNEG;                 /* .. and clear the sign  */
      rhs=b;                            /* use copy from here on  */
      }
    decCompareOp(res, lhs, rhs, set, COMPTOTAL, &status);
    } while(0);                         /* end protected  */

  if (allocbufa!=NULL) free(allocbufa); /* drop any storage used  */
  if (allocbufb!=NULL) free(allocbufb); /* ..  */
  if (status!=0) decStatus(res, status, set);
  return res;
  }